

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makedefs.c
# Opt level: O2

char * xcrypt(char *str)

{
  byte bVar1;
  long lVar2;
  char *p;
  int iVar3;
  byte bVar4;
  
  iVar3 = 1;
  for (lVar2 = 0; bVar1 = str[lVar2], bVar1 != 0; lVar2 = lVar2 + 1) {
    bVar4 = (byte)iVar3;
    if ((bVar1 & 0x60) == 0) {
      bVar4 = 0;
    }
    xcrypt::buf[lVar2] = bVar4 ^ bVar1;
    iVar3 = iVar3 * 2;
    if (0x1f < iVar3) {
      iVar3 = 1;
    }
  }
  xcrypt::buf[lVar2] = '\0';
  return (char *)0x1;
}

Assistant:

static char *xcrypt(const char *str)
{
	static char buf[BUFSZ];
	const char *p;
	char *q;
	int bitmask;

	for (bitmask = 1, p = str, q = buf; *p; q++) {
		*q = *p++;
		if (*q & (32|64)) *q ^= bitmask;
		if ((bitmask <<= 1) >= 32) bitmask = 1;
	}
	*q = '\0';
	return buf;
}